

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckerTester.cpp
# Opt level: O0

void __thiscall psy::C::TypeCheckerTester::case0102(TypeCheckerTester *this)

{
  Expectation local_108;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *s;
  TypeCheckerTester *this_local;
  
  local_18 = "\nvoid _ ()\n{\n    int const x ;\n    x ++ ;\n}\n";
  s = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"\nvoid _ ()\n{\n    int const x ;\n    x ++ ;\n}\n",&local_39);
  Expectation::Expectation(&local_108);
  checkTypes(this,&local_38,&local_108);
  Expectation::~Expectation(&local_108);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void TypeCheckerTester::case0102()
{
    // Not a type (but lvalueness) check error.
    auto s = R"(
void _ ()
{
    int const x ;
    x ++ ;
}
)";

    checkTypes(s, Expectation());
}